

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int fts3ExprLoadDoclistsCb(Fts3Expr *pExpr,int iPhrase,void *ctx)

{
  *(ulong *)((long)ctx + 8) =
       CONCAT44(pExpr->pPhrase->nToken + (int)((ulong)*(undefined8 *)((long)ctx + 8) >> 0x20),
                (int)*(undefined8 *)((long)ctx + 8) + 1);
  return 0;
}

Assistant:

static int fts3ExprLoadDoclistsCb(Fts3Expr *pExpr, int iPhrase, void *ctx){
  int rc = SQLITE_OK;
  Fts3Phrase *pPhrase = pExpr->pPhrase;
  LoadDoclistCtx *p = (LoadDoclistCtx *)ctx;

  UNUSED_PARAMETER(iPhrase);

  p->nPhrase++;
  p->nToken += pPhrase->nToken;

  return rc;
}